

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-blob.cpp
# Opt level: O2

ShaderLibraryHandle __thiscall
nvrhi::createShaderLibraryPermutation
          (nvrhi *this,IDevice *device,void *blob,size_t blobSize,ShaderConstant *constants,
          uint32_t numConstants,bool errorIfNotFound)

{
  bool bVar1;
  long *plVar2;
  size_t *pSize;
  size_t binarySize;
  void *binary;
  string message;
  
  binary = (void *)0x0;
  pSize = &binarySize;
  binarySize = 0;
  bVar1 = findPermutationInBlob(blob,blobSize,constants,numConstants,&binary,pSize);
  if (bVar1) {
    (**(code **)(*(long *)device + 0xa8))(this,device,binary,binarySize);
  }
  else {
    if (errorIfNotFound) {
      formatShaderNotFoundMessage_abi_cxx11_
                (&message,(nvrhi *)blob,(void *)blobSize,(size_t)constants,
                 (ShaderConstant *)(ulong)numConstants,(uint32_t)pSize);
      plVar2 = (long *)(**(code **)(*(long *)device + 0x1b8))(device);
      (**(code **)(*plVar2 + 0x10))(plVar2,2,message._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&message);
    }
    *(undefined8 *)this = 0;
  }
  return (ShaderLibraryHandle)(InterfaceType *)this;
}

Assistant:

ShaderLibraryHandle createShaderLibraryPermutation(IDevice* device, const void* blob, size_t blobSize,
        const ShaderConstant* constants, uint32_t numConstants, bool errorIfNotFound)
    {
        const void* binary = nullptr;
        size_t binarySize = 0;

        if (findPermutationInBlob(blob, blobSize, constants, numConstants, &binary, &binarySize))
        {
            return device->createShaderLibrary(binary, binarySize);
        }

        if (errorIfNotFound)
        {
            std::string message = formatShaderNotFoundMessage(blob, blobSize, constants, numConstants);
            device->getMessageCallback()->message(MessageSeverity::Error, message.c_str());
        }

        return nullptr;
    }